

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

Constraint *
slang::ast::ConditionalConstraint::fromSyntax
          (ConditionalConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *__addr;
  bool bVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  undefined4 extraout_var;
  ConstraintItemSyntax *pCVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  socklen_t __len;
  socklen_t __len_00;
  undefined1 local_60 [8];
  ConstraintExprVisitor visitor;
  ConditionalConstraint *result;
  Constraint *elseBody;
  Constraint *ifBody;
  Expression *local_30;
  Expression *pred;
  Compilation *comp;
  ASTContext *context_local;
  ConditionalConstraintSyntax *syntax_local;
  
  comp = (Compilation *)context;
  context_local = (ASTContext *)syntax;
  pred = (Expression *)ASTContext::getCompilation(context);
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)
                      &context_local->assertionInstance);
  __addr = comp;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&ifBody,None);
  iVar2 = Expression::bind((int)pEVar3,(sockaddr *)__addr,(socklen_t)ifBody);
  local_30 = (Expression *)CONCAT44(extraout_var,iVar2);
  pCVar4 = not_null<slang::syntax::ConstraintItemSyntax_*>::operator*
                     ((not_null<slang::syntax::ConstraintItemSyntax_*> *)&context_local[1].flags);
  iVar2 = Constraint::bind((int)pCVar4,(sockaddr *)comp,__len);
  elseBody = (Constraint *)CONCAT44(extraout_var_00,iVar2);
  result = (ConditionalConstraint *)0x0;
  if (context_local[1].instanceOrProc != (Symbol *)0x0) {
    pCVar4 = not_null<slang::syntax::ConstraintItemSyntax_*>::operator*
                       ((not_null<slang::syntax::ConstraintItemSyntax_*> *)
                        &(context_local[1].instanceOrProc)->parentScope);
    iVar2 = Constraint::bind((int)pCVar4,(sockaddr *)comp,__len_00);
    result = (ConditionalConstraint *)CONCAT44(extraout_var_01,iVar2);
  }
  visitor._8_8_ =
       BumpAllocator::
       emplace<slang::ast::ConditionalConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&,slang::ast::Constraint_const*&>
                 ((BumpAllocator *)pred,local_30,elseBody,(Constraint **)&result);
  bVar1 = Expression::bad(local_30);
  if (((bVar1) || (bVar1 = Constraint::bad(elseBody), bVar1)) ||
     ((result != (ConditionalConstraint *)0x0 &&
      (bVar1 = Constraint::bad(&result->super_Constraint), bVar1)))) {
    syntax_local = (ConditionalConstraintSyntax *)
                   Constraint::badConstraint((Compilation *)pred,(Constraint *)visitor._8_8_);
  }
  else {
    ConstraintExprVisitor::ConstraintExprVisitor
              ((ConstraintExprVisitor *)local_60,(ASTContext *)comp,false);
    bVar1 = Expression::visit<slang::ast::ConstraintExprVisitor&>
                      (local_30,(ConstraintExprVisitor *)local_60);
    if (bVar1) {
      syntax_local = (ConditionalConstraintSyntax *)visitor._8_8_;
    }
    else {
      syntax_local = (ConditionalConstraintSyntax *)
                     Constraint::badConstraint((Compilation *)pred,(Constraint *)visitor._8_8_);
    }
  }
  return (Constraint *)syntax_local;
}

Assistant:

Constraint& ConditionalConstraint::fromSyntax(const ConditionalConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& pred = Expression::bind(*syntax.condition, context);
    auto& ifBody = Constraint::bind(*syntax.constraints, context);

    const Constraint* elseBody = nullptr;
    if (syntax.elseClause)
        elseBody = &Constraint::bind(*syntax.elseClause->constraints, context);

    auto result = comp.emplace<ConditionalConstraint>(pred, ifBody, elseBody);
    if (pred.bad() || ifBody.bad() || (elseBody && elseBody->bad()))
        return badConstraint(comp, result);

    ConstraintExprVisitor visitor(context, /* isSoft */ false);
    if (!pred.visit(visitor))
        return badConstraint(comp, result);

    return *result;
}